

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall ieee754::is_mantissa_zero(ieee754 *this)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ieee754 *in_RDI;
  int i;
  int sum;
  int imsb;
  int local_14;
  uint local_10;
  
  iVar3 = mantissa_msb_index(in_RDI);
  bVar1 = in_RDI->buf[iVar3];
  bVar2 = mantissa_msb_mask(in_RDI);
  local_10 = (uint)(bVar1 & bVar2);
  for (local_14 = 0; local_14 < iVar3; local_14 = local_14 + 1) {
    local_10 = in_RDI->buf[local_14] + local_10;
  }
  return (int)(local_10 == 0);
}

Assistant:

int is_mantissa_zero() const
    {
        /* add up the full bytes of the mantissa, plus the partial high byte */
        int imsb = mantissa_msb_index();
        int sum = buf[imsb] & mantissa_msb_mask();
        for (int i = 0 ; i < imsb ; sum += buf[i++]) ;

        /* the mantissa is zero if the sum of the bytes is zero */
        return (sum == 0);
    }